

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnn.c
# Opt level: O1

void LetterCNNModelInit(LetterCNNClassifier *model)

{
  model->init = '\x01';
  (model->model_all).inputHeight = 0xf;
  (model->model_all).inputWidthStep = 0xf;
  (model->model_all).C11.outChannels = 10;
  (model->model_all).C11.inChannels = 1;
  (model->model_all).C11.height = 3;
  (model->model_all).C11.widthStep = 3;
  (model->model_all).S12.channels = 10;
  (model->model_all).S12.height = 2;
  (model->model_all).S12.widthStep = 2;
  (model->model_all).S12.poolType = 1;
  (model->model_all).FC1.inputNum = 0x168;
  (model->model_all).FC1.outputNum = 0x28;
  (model->model_all).FC2.inputNum = 0x28;
  (model->model_all).FC2.outputNum = 0x22;
  (model->model_binary_0D).inputHeight = 0xf;
  (model->model_binary_0D).inputWidthStep = 8;
  (model->model_binary_0D).C11.outChannels = 10;
  (model->model_binary_0D).C11.inChannels = 1;
  (model->model_binary_0D).C11.height = 3;
  (model->model_binary_0D).C11.widthStep = 3;
  (model->model_binary_0D).S12.channels = 10;
  (model->model_binary_0D).S12.height = 2;
  (model->model_binary_0D).S12.widthStep = 2;
  (model->model_binary_0D).S12.poolType = 1;
  (model->model_binary_0D).FC1.inputNum = 0xb4;
  (model->model_binary_0D).FC1.outputNum = 0x14;
  (model->model_binary_0D).FC2.inputNum = 0x14;
  (model->model_binary_0D).FC2.outputNum = 2;
  (model->model_binary_0Q).inputHeight = 7;
  (model->model_binary_0Q).inputWidthStep = 0xf;
  (model->model_binary_0Q).C11.outChannels = 10;
  (model->model_binary_0Q).C11.inChannels = 1;
  (model->model_binary_0Q).C11.height = 3;
  (model->model_binary_0Q).C11.widthStep = 3;
  (model->model_binary_0Q).S12.channels = 10;
  (model->model_binary_0Q).S12.height = 2;
  (model->model_binary_0Q).S12.widthStep = 2;
  (model->model_binary_0Q).S12.poolType = 1;
  (model->model_binary_0Q).FC1.inputNum = 0x78;
  (model->model_binary_0Q).FC1.outputNum = 0x14;
  (model->model_binary_0Q).FC2.inputNum = 0x14;
  (model->model_binary_0Q).FC2.outputNum = 2;
  (model->model_binary_0G).inputHeight = 10;
  (model->model_binary_0G).inputWidthStep = 10;
  (model->model_binary_0G).C11.outChannels = 10;
  (model->model_binary_0G).C11.inChannels = 1;
  (model->model_binary_0G).C11.height = 3;
  (model->model_binary_0G).C11.widthStep = 3;
  (model->model_binary_0G).S12.channels = 10;
  (model->model_binary_0G).S12.height = 2;
  (model->model_binary_0G).S12.widthStep = 2;
  (model->model_binary_0G).S12.poolType = 1;
  (model->model_binary_0G).FC1.inputNum = 0x78;
  (model->model_binary_0G).FC1.outputNum = 0x14;
  (model->model_binary_0G).FC2.inputNum = 0x14;
  (model->model_binary_0G).FC2.outputNum = 2;
  return;
}

Assistant:

void LetterCNNModelInit(LetterCNNClassifier *model) {


    //region 34分类
    //    1's layer - input layer : 15*15
    model->init = 1;
    model->model_all.inputHeight = 15;
    model->model_all.inputWidthStep = 15;
//    2's layer - convolution Layer 1 : 10*1*3*3
    model->model_all.C11.outChannels = 10;
    model->model_all.C11.inChannels = 1;
    model->model_all.C11.height = 3;
    model->model_all.C11.widthStep = 3;

//    3's layer - subsample layer 1 : 10*2*2
    model->model_all.S12.channels = 10;
    model->model_all.S12.height = 2;
    model->model_all.S12.widthStep = 2;
    model->model_all.S12.poolType = MaxPool;


//    4's layer - full connected layer : 360*40
    model->model_all.FC1.inputNum = 360;
    model->model_all.FC1.outputNum = 40;

//    5's layer - full connected layer : 40*34
    model->model_all.FC2.inputNum = 40;
    model->model_all.FC2.outputNum = 34;
    //endregion


    //region 二分类器 0-D
    //    1's layer - input layer : 15*8
    model->init = 1;
    model->model_binary_0D.inputHeight = 15;
    model->model_binary_0D.inputWidthStep = 8;
//    2's layer - convolution Layer 1 : 10*1*3*3
    model->model_binary_0D.C11.outChannels = 10;
    model->model_binary_0D.C11.inChannels = 1;
    model->model_binary_0D.C11.height = 3;
    model->model_binary_0D.C11.widthStep = 3;

    //    3's layer - subsample layer 1 : 10*2*2
    model->model_binary_0D.S12.channels = 10;
    model->model_binary_0D.S12.height = 2;
    model->model_binary_0D.S12.widthStep = 2;
    model->model_binary_0D.S12.poolType = MaxPool;

    //    4's layer - full connected layer : 180*20
    model->model_binary_0D.FC1.inputNum = 180;
    model->model_binary_0D.FC1.outputNum = 20;

//    5's layer - full connected layer : 20*2
    model->model_binary_0D.FC2.inputNum = 20;
    model->model_binary_0D.FC2.outputNum = 2;

    //endregion

    //region 二分类器 0-Q
    //    1's layer - input layer : 7*15
    model->init = 1;
    model->model_binary_0Q.inputHeight = 7;
    model->model_binary_0Q.inputWidthStep = 15;
//    2's layer - convolution Layer 1 : 10*1*3*3
    model->model_binary_0Q.C11.outChannels = 10;
    model->model_binary_0Q.C11.inChannels = 1;
    model->model_binary_0Q.C11.height = 3;
    model->model_binary_0Q.C11.widthStep = 3;

    //    3's layer - subsample layer 1 : 10*2*2
    model->model_binary_0Q.S12.channels = 10;
    model->model_binary_0Q.S12.height = 2;
    model->model_binary_0Q.S12.widthStep = 2;
    model->model_binary_0Q.S12.poolType = MaxPool;

    //    4's layer - full connected layer : 120*20
    model->model_binary_0Q.FC1.inputNum = 120;
    model->model_binary_0Q.FC1.outputNum = 20;

//    5's layer - full connected layer : 20*2
    model->model_binary_0Q.FC2.inputNum = 20;
    model->model_binary_0Q.FC2.outputNum = 2;

    //endregion

    //region 二分类器 0-G
    //    1's layer - input layer : 15*7
    model->init = 1;
    model->model_binary_0G.inputHeight = 10;
    model->model_binary_0G.inputWidthStep = 10;
//    2's layer - convolution Layer 1 : 10*1*3*3
    model->model_binary_0G.C11.outChannels = 10;
    model->model_binary_0G.C11.inChannels = 1;
    model->model_binary_0G.C11.height = 3;
    model->model_binary_0G.C11.widthStep = 3;

    //    3's layer - subsample layer 1 : 10*2*2
    model->model_binary_0G.S12.channels = 10;
    model->model_binary_0G.S12.height = 2;
    model->model_binary_0G.S12.widthStep = 2;
    model->model_binary_0G.S12.poolType = MaxPool;

    //    4's layer - full connected layer : 120*20
    model->model_binary_0G.FC1.inputNum = 120;
    model->model_binary_0G.FC1.outputNum = 20;

//    5's layer - full connected layer : 20*2
    model->model_binary_0G.FC2.inputNum = 20;
    model->model_binary_0G.FC2.outputNum = 2;

    //endregion


}